

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O3

SPxId __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnter(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *val,int param_2,bool polish)

{
  double dVar1;
  char cVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar5;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  long lVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar11;
  byte bVar12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar15;
  uint *puVar16;
  cpp_dec_float<200u,int,void> *pcVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  uint uVar19;
  DataKey DVar20;
  byte bVar21;
  ulong uVar22;
  int nr;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  bestDelta;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxabs;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sel;
  cpp_dec_float<200U,_int,_void> vv;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  delta_shift;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lowstab;
  int local_adc;
  DataKey local_ad8;
  uint local_ad0;
  uint local_acc;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_ac8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a40;
  cpp_dec_float<200U,_int,_void> local_a38;
  cpp_dec_float<200U,_int,_void> local_9b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_938;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined5 uStack_850;
  undefined3 uStack_84b;
  int iStack_848;
  undefined1 uStack_844;
  undefined8 local_840;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_838;
  cpp_dec_float<200U,_int,_void> local_7b8;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined5 uStack_6d0;
  undefined3 uStack_6cb;
  int iStack_6c8;
  undefined1 uStack_6c4;
  undefined8 local_6c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_638;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_538;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_438;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_338;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_238;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_138;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b8;
  
  bVar21 = 0;
  local_ad8.info = 0;
  local_ad8.idx = -1;
  local_ac8.m_backend.fpclass = cpp_dec_float_finite;
  local_ac8.m_backend.prec_elem = 0x1c;
  local_ac8.m_backend.data._M_elems[0] = 0;
  local_ac8.m_backend.data._M_elems[1] = 0;
  local_ac8.m_backend.data._M_elems[2] = 0;
  local_ac8.m_backend.data._M_elems[3] = 0;
  local_ac8.m_backend.data._M_elems[4] = 0;
  local_ac8.m_backend.data._M_elems[5] = 0;
  local_ac8.m_backend.data._M_elems[6] = 0;
  local_ac8.m_backend.data._M_elems[7] = 0;
  local_ac8.m_backend.data._M_elems[8] = 0;
  local_ac8.m_backend.data._M_elems[9] = 0;
  local_ac8.m_backend.data._M_elems[10] = 0;
  local_ac8.m_backend.data._M_elems[0xb] = 0;
  local_ac8.m_backend.data._M_elems[0xc] = 0;
  local_ac8.m_backend.data._M_elems[0xd] = 0;
  local_ac8.m_backend.data._M_elems[0xe] = 0;
  local_ac8.m_backend.data._M_elems[0xf] = 0;
  local_ac8.m_backend.data._M_elems[0x10] = 0;
  local_ac8.m_backend.data._M_elems[0x11] = 0;
  local_ac8.m_backend.data._M_elems[0x12] = 0;
  local_ac8.m_backend.data._M_elems[0x13] = 0;
  local_ac8.m_backend.data._M_elems[0x14] = 0;
  local_ac8.m_backend.data._M_elems[0x15] = 0;
  local_ac8.m_backend.data._M_elems[0x16] = 0;
  local_ac8.m_backend.data._M_elems[0x17] = 0;
  local_ac8.m_backend.data._M_elems[0x18] = 0;
  local_ac8.m_backend.data._M_elems[0x19] = 0;
  local_ac8.m_backend.data._M_elems._104_5_ = 0;
  local_ac8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  local_ac8.m_backend.exp = 0;
  local_ac8.m_backend.neg = false;
  local_838.m_backend.fpclass = cpp_dec_float_finite;
  local_838.m_backend.prec_elem = 0x1c;
  local_838.m_backend.data._M_elems[0] = 0;
  local_838.m_backend.data._M_elems[1] = 0;
  local_838.m_backend.data._M_elems[2] = 0;
  local_838.m_backend.data._M_elems[3] = 0;
  local_838.m_backend.data._M_elems[4] = 0;
  local_838.m_backend.data._M_elems[5] = 0;
  local_838.m_backend.data._M_elems[6] = 0;
  local_838.m_backend.data._M_elems[7] = 0;
  local_838.m_backend.data._M_elems[8] = 0;
  local_838.m_backend.data._M_elems[9] = 0;
  local_838.m_backend.data._M_elems[10] = 0;
  local_838.m_backend.data._M_elems[0xb] = 0;
  local_838.m_backend.data._M_elems[0xc] = 0;
  local_838.m_backend.data._M_elems[0xd] = 0;
  local_838.m_backend.data._M_elems[0xe] = 0;
  local_838.m_backend.data._M_elems[0xf] = 0;
  local_838.m_backend.data._M_elems[0x10] = 0;
  local_838.m_backend.data._M_elems[0x11] = 0;
  local_838.m_backend.data._M_elems[0x12] = 0;
  local_838.m_backend.data._M_elems[0x13] = 0;
  local_838.m_backend.data._M_elems[0x14] = 0;
  local_838.m_backend.data._M_elems[0x15] = 0;
  local_838.m_backend.data._M_elems[0x16] = 0;
  local_838.m_backend.data._M_elems[0x17] = 0;
  local_838.m_backend.data._M_elems[0x18] = 0;
  local_838.m_backend.data._M_elems[0x19] = 0;
  local_838.m_backend.data._M_elems._104_5_ = 0;
  local_838.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  local_838.m_backend.exp = 0;
  local_838.m_backend.neg = false;
  local_840._0_4_ = cpp_dec_float_finite;
  local_840._4_4_ = 0x1c;
  local_8b8 = 0;
  uStack_8b0 = 0;
  local_8a8 = 0;
  uStack_8a0 = 0;
  local_898 = 0;
  uStack_890 = 0;
  local_888 = 0;
  uStack_880 = 0;
  local_878 = 0;
  uStack_870 = 0;
  local_868 = 0;
  uStack_860 = 0;
  local_858 = 0;
  uStack_850 = 0;
  uStack_84b = 0;
  iStack_848 = 0;
  uStack_844 = 0;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_8b8,0.0);
  peVar3 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  dVar1 = peVar3->s_epsilon_multiplier;
  uVar22 = -(ulong)(dVar1 == 1.0);
  local_6c0._0_4_ = cpp_dec_float_finite;
  local_6c0._4_4_ = 0x1c;
  local_738 = 0;
  uStack_730 = 0;
  local_728 = 0;
  uStack_720 = 0;
  local_718 = 0;
  uStack_710 = 0;
  local_708 = 0;
  uStack_700 = 0;
  local_6f8 = 0;
  uStack_6f0 = 0;
  local_6e8 = 0;
  uStack_6e0 = 0;
  local_6d8 = 0;
  uStack_6d0 = 0;
  uStack_6cb = 0;
  iStack_6c8 = 0;
  uStack_6c4 = 0;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_738,
             (double)(~uVar22 & (ulong)(dVar1 * 1e-05) | uVar22 & 0x3ee4f8b588e368f1));
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  resetTols(this);
  iVar8 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  cVar2 = *(char *)(CONCAT44(extraout_var,iVar8) + 0xa60);
  peVar3 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  dVar1 = peVar3->s_epsilon_multiplier;
  uVar22 = -(ulong)(dVar1 == 1.0);
  local_b8.m_backend.fpclass = cpp_dec_float_finite;
  local_b8.m_backend.prec_elem = 0x1c;
  local_b8.m_backend.data._M_elems[0] = 0;
  local_b8.m_backend.data._M_elems[1] = 0;
  local_b8.m_backend.data._M_elems[2] = 0;
  local_b8.m_backend.data._M_elems[3] = 0;
  local_b8.m_backend.data._M_elems[4] = 0;
  local_b8.m_backend.data._M_elems[5] = 0;
  local_b8.m_backend.data._M_elems[6] = 0;
  local_b8.m_backend.data._M_elems[7] = 0;
  local_b8.m_backend.data._M_elems[8] = 0;
  local_b8.m_backend.data._M_elems[9] = 0;
  local_b8.m_backend.data._M_elems[10] = 0;
  local_b8.m_backend.data._M_elems[0xb] = 0;
  local_b8.m_backend.data._M_elems[0xc] = 0;
  local_b8.m_backend.data._M_elems[0xd] = 0;
  local_b8.m_backend.data._M_elems[0xe] = 0;
  local_b8.m_backend.data._M_elems[0xf] = 0;
  local_b8.m_backend.data._M_elems[0x10] = 0;
  local_b8.m_backend.data._M_elems[0x11] = 0;
  local_b8.m_backend.data._M_elems[0x12] = 0;
  local_b8.m_backend.data._M_elems[0x13] = 0;
  local_b8.m_backend.data._M_elems[0x14] = 0;
  local_b8.m_backend.data._M_elems[0x15] = 0;
  local_b8.m_backend.data._M_elems[0x16] = 0;
  local_b8.m_backend.data._M_elems[0x17] = 0;
  local_b8.m_backend.data._M_elems[0x18] = 0;
  local_b8.m_backend.data._M_elems[0x19] = 0;
  local_b8.m_backend.data._M_elems._104_5_ = 0;
  local_b8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  local_b8.m_backend.exp = 0;
  local_b8.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_b8,
             (double)(~uVar22 & (ulong)(dVar1 * 1e-10) | uVar22 & 0x3ddb7cdfd9d7bdbb));
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_838,0.0);
  pnVar11 = &this->epsilon;
  pnVar13 = pnVar11;
  pcVar14 = &local_7b8;
  for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
    (pcVar14->data)._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
    pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar13 + (ulong)bVar21 * -8 + 4);
    pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + ((ulong)bVar21 * -2 + 1) * 4);
  }
  local_7b8.exp = (this->epsilon).m_backend.exp;
  local_7b8.neg = (this->epsilon).m_backend.neg;
  local_7b8.fpclass = (this->epsilon).m_backend.fpclass;
  local_7b8.prec_elem = (this->epsilon).m_backend.prec_elem;
  local_acc = (uint)CONCAT71(in_register_00000009,polish);
  local_a40 = pnVar11;
  bVar12 = local_7b8.neg;
  if (local_7b8.fpclass == cpp_dec_float_NaN || (val->m_backend).fpclass == cpp_dec_float_NaN) {
LAB_005b90f9:
    pcVar14 = &local_7b8;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pcVar14->data)._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar11 + (ulong)bVar21 * -8 + 4);
      pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + ((ulong)bVar21 * -2 + 1) * 4);
    }
    local_7b8.neg = (bool)bVar12;
    if (local_7b8.data._M_elems[0] != 0 || local_7b8.fpclass != cpp_dec_float_finite) {
      local_7b8.neg = (bool)(bVar12 ^ 1);
    }
    if (((local_7b8.fpclass != cpp_dec_float_NaN) && ((val->m_backend).fpclass != cpp_dec_float_NaN)
        ) && (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (&val->m_backend,&local_7b8), iVar8 < 0)) {
      uVar19 = local_acc & 0xff;
      iVar8 = 0;
      local_ad0 = local_acc & 0xff;
      do {
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_8b8,0.0);
        pnVar11 = val;
        pnVar13 = &local_ac8;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pnVar13->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
          pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar11 + ((ulong)bVar21 * -2 + 1) * 4);
          pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar13 + ((ulong)bVar21 * -2 + 1) * 4);
        }
        local_ac8.m_backend.exp = (val->m_backend).exp;
        local_ac8.m_backend.neg = (val->m_backend).neg;
        local_ac8.m_backend.fpclass = (val->m_backend).fpclass;
        local_ac8.m_backend.prec_elem = (val->m_backend).prec_elem;
        local_ad8 = (DataKey)minDelta(this,&local_adc,&local_ac8,
                                      (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)&local_8b8);
        DVar20 = local_ad8;
        if (local_ad8.info == 0) goto LAB_005b97bf;
        pnVar11 = &local_ac8;
        pnVar13 = &local_438;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pnVar13->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
          pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar11 + ((ulong)bVar21 * -2 + 1) * 4);
          pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar13 + ((ulong)bVar21 * -2 + 1) * 4);
        }
        local_438.m_backend.exp = local_ac8.m_backend.exp;
        local_438.m_backend.neg = local_ac8.m_backend.neg;
        local_438.m_backend.fpclass = local_ac8.m_backend.fpclass;
        local_438.m_backend.prec_elem = local_ac8.m_backend.prec_elem;
        pcVar17 = (cpp_dec_float<200u,int,void> *)&local_8b8;
        pnVar11 = &local_4b8;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pnVar11->m_backend).data._M_elems[0] = *(uint *)pcVar17;
          pcVar17 = pcVar17 + (ulong)bVar21 * -8 + 4;
          pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar11 + ((ulong)bVar21 * -2 + 1) * 4);
        }
        local_4b8.m_backend.exp = iStack_848;
        local_4b8.m_backend.neg = (bool)uStack_844;
        local_4b8.m_backend.fpclass = (fpclass_type)local_840;
        local_4b8.m_backend.prec_elem = local_840._4_4_;
        bVar7 = shortEnter(this,(SPxId *)&local_ad8,local_adc,&local_438,&local_4b8);
        if (!bVar7) {
          local_9b8.fpclass = cpp_dec_float_finite;
          local_9b8.prec_elem = 0x1c;
          local_9b8.data._M_elems[0] = 0;
          local_9b8.data._M_elems[1] = 0;
          local_9b8.data._M_elems[2] = 0;
          local_9b8.data._M_elems[3] = 0;
          local_9b8.data._M_elems[4] = 0;
          local_9b8.data._M_elems[5] = 0;
          local_9b8.data._M_elems[6] = 0;
          local_9b8.data._M_elems[7] = 0;
          local_9b8.data._M_elems[8] = 0;
          local_9b8.data._M_elems[9] = 0;
          local_9b8.data._M_elems[10] = 0;
          local_9b8.data._M_elems[0xb] = 0;
          local_9b8.data._M_elems[0xc] = 0;
          local_9b8.data._M_elems[0xd] = 0;
          local_9b8.data._M_elems[0xe] = 0;
          local_9b8.data._M_elems[0xf] = 0;
          local_9b8.data._M_elems[0x10] = 0;
          local_9b8.data._M_elems[0x11] = 0;
          local_9b8.data._M_elems[0x12] = 0;
          local_9b8.data._M_elems[0x13] = 0;
          local_9b8.data._M_elems[0x14] = 0;
          local_9b8.data._M_elems[0x15] = 0;
          local_9b8.data._M_elems[0x16] = 0;
          local_9b8.data._M_elems[0x17] = 0;
          local_9b8.data._M_elems[0x18] = 0;
          local_9b8.data._M_elems[0x19] = 0;
          local_9b8.data._M_elems._104_5_ = 0;
          local_9b8.data._M_elems[0x1b]._1_3_ = 0;
          local_9b8.exp = 0;
          local_9b8.neg = false;
          local_938.m_backend.fpclass = cpp_dec_float_finite;
          local_938.m_backend.prec_elem = 0x1c;
          local_938.m_backend.data._M_elems[0] = 0;
          local_938.m_backend.data._M_elems[1] = 0;
          local_938.m_backend.data._M_elems[2] = 0;
          local_938.m_backend.data._M_elems[3] = 0;
          local_938.m_backend.data._M_elems[4] = 0;
          local_938.m_backend.data._M_elems[5] = 0;
          local_938.m_backend.data._M_elems[6] = 0;
          local_938.m_backend.data._M_elems[7] = 0;
          local_938.m_backend.data._M_elems[8] = 0;
          local_938.m_backend.data._M_elems[9] = 0;
          local_938.m_backend.data._M_elems[10] = 0;
          local_938.m_backend.data._M_elems[0xb] = 0;
          local_938.m_backend.data._M_elems[0xc] = 0;
          local_938.m_backend.data._M_elems[0xd] = 0;
          local_938.m_backend.data._M_elems[0xe] = 0;
          local_938.m_backend.data._M_elems[0xf] = 0;
          local_938.m_backend.data._M_elems[0x10] = 0;
          local_938.m_backend.data._M_elems[0x11] = 0;
          local_938.m_backend.data._M_elems[0x12] = 0;
          local_938.m_backend.data._M_elems[0x13] = 0;
          local_938.m_backend.data._M_elems[0x14] = 0;
          local_938.m_backend.data._M_elems[0x15] = 0;
          local_938.m_backend.data._M_elems[0x16] = 0;
          local_938.m_backend.data._M_elems[0x17] = 0;
          local_938.m_backend.data._M_elems[0x18] = 0;
          local_938.m_backend.data._M_elems[0x19] = 0;
          local_938.m_backend.data._M_elems._104_5_ = 0;
          local_938.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          local_938.m_backend.exp = 0;
          local_938.m_backend.neg = false;
          pcVar17 = (cpp_dec_float<200u,int,void> *)&local_8b8;
          pnVar11 = &local_538;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pnVar11->m_backend).data._M_elems[0] = *(uint *)pcVar17;
            pcVar17 = pcVar17 + (ulong)bVar21 * -8 + 4;
            pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar11 + ((ulong)bVar21 * -2 + 1) * 4);
          }
          local_538.m_backend.exp = iStack_848;
          local_538.m_backend.neg = (bool)uStack_844;
          local_538.m_backend.fpclass = (fpclass_type)local_840;
          local_538.m_backend.prec_elem = local_840._4_4_;
          minStability((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_7b8,this,&local_538);
          pnVar11 = &local_938;
          pcVar14 = &local_7b8;
          pnVar13 = pnVar11;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pnVar13->m_backend).data._M_elems[0] =
                 (((cpp_dec_float<200U,_int,_void> *)&pcVar14->data)->data)._M_elems[0];
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar14 + ((ulong)bVar21 * -2 + 1) * 4);
            pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar13 + ((ulong)bVar21 * -2 + 1) * 4);
          }
          local_938.m_backend.exp = local_7b8.exp;
          local_938.m_backend.neg = local_7b8.neg;
          local_938.m_backend.fpclass = local_7b8.fpclass;
          local_938.m_backend.prec_elem = local_7b8.prec_elem;
          if (cVar2 == '\0') {
            pnVar13 = &local_638;
            pnVar15 = &local_ac8;
            pnVar18 = pnVar13;
            for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
              (pnVar18->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
              pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar15 + ((ulong)bVar21 * -2 + 1) * 4);
              pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar18 + ((ulong)bVar21 * -2 + 1) * 4);
            }
            local_638.m_backend.exp = local_ac8.m_backend.exp;
            local_638.m_backend.neg = local_ac8.m_backend.neg;
            local_638.m_backend.fpclass = local_ac8.m_backend.fpclass;
            local_638.m_backend.prec_elem = local_ac8.m_backend.prec_elem;
          }
          else {
            pnVar13 = &local_5b8;
            pnVar11 = &local_ac8;
            pnVar15 = pnVar13;
            for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
              (pnVar15->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
              pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar11 + ((ulong)bVar21 * -2 + 1) * 4);
              pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar15 + ((ulong)bVar21 * -2 + 1) * 4);
            }
            local_5b8.m_backend.exp = local_ac8.m_backend.exp;
            local_5b8.m_backend.neg = local_ac8.m_backend.neg;
            local_5b8.m_backend.fpclass = local_ac8.m_backend.fpclass;
            local_5b8.m_backend.prec_elem = local_ac8.m_backend.prec_elem;
            pnVar11 = &local_b8;
          }
          local_ad8 = (DataKey)minSelect(this,&local_adc,&local_838,pnVar11,
                                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_9b8,pnVar13);
          local_a38.fpclass = cpp_dec_float_finite;
          local_a38.prec_elem = 0x1c;
          local_a38.data._M_elems[0] = 0;
          local_a38.data._M_elems[1] = 0;
          local_a38.data._M_elems[2] = 0;
          local_a38.data._M_elems[3] = 0;
          local_a38.data._M_elems[4] = 0;
          local_a38.data._M_elems[5] = 0;
          local_a38.data._M_elems[6] = 0;
          local_a38.data._M_elems[7] = 0;
          local_a38.data._M_elems[8] = 0;
          local_a38.data._M_elems[9] = 0;
          local_a38.data._M_elems[10] = 0;
          local_a38.data._M_elems[0xb] = 0;
          local_a38.data._M_elems[0xc] = 0;
          local_a38.data._M_elems[0xd] = 0;
          local_a38.data._M_elems[0xe] = 0;
          local_a38.data._M_elems[0xf] = 0;
          local_a38.data._M_elems[0x10] = 0;
          local_a38.data._M_elems[0x11] = 0;
          local_a38.data._M_elems[0x12] = 0;
          local_a38.data._M_elems[0x13] = 0;
          local_a38.data._M_elems[0x14] = 0;
          local_a38.data._M_elems[0x15] = 0;
          local_a38.data._M_elems[0x16] = 0;
          local_a38.data._M_elems[0x17] = 0;
          local_a38.data._M_elems[0x18] = 0;
          local_a38.data._M_elems[0x19] = 0;
          local_a38.data._M_elems._104_5_ = 0;
          local_a38.data._M_elems[0x1b]._1_3_ = 0;
          local_a38.exp = 0;
          local_a38.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                    (&local_7b8,2,(type *)0x0);
          puVar16 = (uint *)&local_738;
          pcVar14 = &local_a38;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pcVar14->data)._M_elems[0] = *puVar16;
            puVar16 = puVar16 + (ulong)bVar21 * -2 + 1;
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar21 * -8 + 4);
          }
          local_a38.exp = iStack_6c8;
          local_a38.neg = (bool)uStack_6c4;
          local_a38.fpclass = (fpclass_type)local_6c0;
          local_a38.prec_elem = local_6c0._4_4_;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&local_a38,&local_7b8);
          if ((local_9b8.fpclass != cpp_dec_float_NaN) && (local_a38.fpclass != cpp_dec_float_NaN))
          {
            iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_9b8,&local_a38);
            iVar8 = iVar8 + (iVar9 >> 0x1f);
          }
          iVar8 = iVar8 + 2;
          uVar19 = local_ad0;
        }
        pcVar17 = (cpp_dec_float<200u,int,void> *)&local_8b8;
        pnVar11 = &local_6b8;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pnVar11->m_backend).data._M_elems[0] = *(uint *)pcVar17;
          pcVar17 = pcVar17 + (ulong)bVar21 * -8 + 4;
          pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar11 + ((ulong)bVar21 * -2 + 1) * 4);
        }
        local_6b8.m_backend.exp = iStack_848;
        local_6b8.m_backend.neg = (bool)uStack_844;
        local_6b8.m_backend.fpclass = (fpclass_type)local_840;
        local_6b8.m_backend.prec_elem = local_840._4_4_;
        bVar7 = minReEnter(this,&local_838,&local_6b8,(SPxId *)&local_ad8,local_adc,SUB41(uVar19,0))
        ;
      } while ((bVar7) && (relax(this), iVar8 < 2));
    }
  }
  else {
    iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                      (&val->m_backend,&local_7b8);
    if (iVar8 < 1) {
      local_7b8.exp = (this->epsilon).m_backend.exp;
      bVar12 = (this->epsilon).m_backend.neg;
      local_7b8.fpclass = (this->epsilon).m_backend.fpclass;
      local_7b8.prec_elem = (this->epsilon).m_backend.prec_elem;
      goto LAB_005b90f9;
    }
    uVar19 = (uint)polish;
    iVar8 = 0;
    local_ad0 = (uint)polish;
    do {
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_8b8,0.0);
      pnVar11 = val;
      pnVar13 = &local_ac8;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pnVar13->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
        pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar11 + ((ulong)bVar21 * -2 + 1) * 4);
        pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar13 + ((ulong)bVar21 * -2 + 1) * 4);
      }
      local_ac8.m_backend.exp = (val->m_backend).exp;
      local_ac8.m_backend.neg = (val->m_backend).neg;
      local_ac8.m_backend.fpclass = (val->m_backend).fpclass;
      local_ac8.m_backend.prec_elem = (val->m_backend).prec_elem;
      local_ad8 = (DataKey)maxDelta(this,&local_adc,&local_ac8,
                                    (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)&local_8b8);
      DVar20 = local_ad8;
      if (local_ad8.info == 0) goto LAB_005b97bf;
      pnVar11 = &local_ac8;
      pnVar13 = &local_138;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pnVar13->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
        pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar11 + ((ulong)bVar21 * -2 + 1) * 4);
        pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar13 + ((ulong)bVar21 * -2 + 1) * 4);
      }
      local_138.m_backend.exp = local_ac8.m_backend.exp;
      local_138.m_backend.neg = local_ac8.m_backend.neg;
      local_138.m_backend.fpclass = local_ac8.m_backend.fpclass;
      local_138.m_backend.prec_elem = local_ac8.m_backend.prec_elem;
      pcVar17 = (cpp_dec_float<200u,int,void> *)&local_8b8;
      pnVar11 = &local_1b8;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pnVar11->m_backend).data._M_elems[0] = *(uint *)pcVar17;
        pcVar17 = pcVar17 + (ulong)bVar21 * -8 + 4;
        pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar11 + ((ulong)bVar21 * -2 + 1) * 4);
      }
      local_1b8.m_backend.exp = iStack_848;
      local_1b8.m_backend.neg = (bool)uStack_844;
      local_1b8.m_backend.fpclass = (fpclass_type)local_840;
      local_1b8.m_backend.prec_elem = local_840._4_4_;
      bVar7 = shortEnter(this,(SPxId *)&local_ad8,local_adc,&local_138,&local_1b8);
      if (!bVar7) {
        local_9b8.fpclass = cpp_dec_float_finite;
        local_9b8.prec_elem = 0x1c;
        local_9b8.data._M_elems[0] = 0;
        local_9b8.data._M_elems[1] = 0;
        local_9b8.data._M_elems[2] = 0;
        local_9b8.data._M_elems[3] = 0;
        local_9b8.data._M_elems[4] = 0;
        local_9b8.data._M_elems[5] = 0;
        local_9b8.data._M_elems[6] = 0;
        local_9b8.data._M_elems[7] = 0;
        local_9b8.data._M_elems[8] = 0;
        local_9b8.data._M_elems[9] = 0;
        local_9b8.data._M_elems[10] = 0;
        local_9b8.data._M_elems[0xb] = 0;
        local_9b8.data._M_elems[0xc] = 0;
        local_9b8.data._M_elems[0xd] = 0;
        local_9b8.data._M_elems[0xe] = 0;
        local_9b8.data._M_elems[0xf] = 0;
        local_9b8.data._M_elems[0x10] = 0;
        local_9b8.data._M_elems[0x11] = 0;
        local_9b8.data._M_elems[0x12] = 0;
        local_9b8.data._M_elems[0x13] = 0;
        local_9b8.data._M_elems[0x14] = 0;
        local_9b8.data._M_elems[0x15] = 0;
        local_9b8.data._M_elems[0x16] = 0;
        local_9b8.data._M_elems[0x17] = 0;
        local_9b8.data._M_elems[0x18] = 0;
        local_9b8.data._M_elems[0x19] = 0;
        local_9b8.data._M_elems._104_5_ = 0;
        local_9b8.data._M_elems[0x1b]._1_3_ = 0;
        local_9b8.exp = 0;
        local_9b8.neg = false;
        local_938.m_backend.fpclass = cpp_dec_float_finite;
        local_938.m_backend.prec_elem = 0x1c;
        local_938.m_backend.data._M_elems[0] = 0;
        local_938.m_backend.data._M_elems[1] = 0;
        local_938.m_backend.data._M_elems[2] = 0;
        local_938.m_backend.data._M_elems[3] = 0;
        local_938.m_backend.data._M_elems[4] = 0;
        local_938.m_backend.data._M_elems[5] = 0;
        local_938.m_backend.data._M_elems[6] = 0;
        local_938.m_backend.data._M_elems[7] = 0;
        local_938.m_backend.data._M_elems[8] = 0;
        local_938.m_backend.data._M_elems[9] = 0;
        local_938.m_backend.data._M_elems[10] = 0;
        local_938.m_backend.data._M_elems[0xb] = 0;
        local_938.m_backend.data._M_elems[0xc] = 0;
        local_938.m_backend.data._M_elems[0xd] = 0;
        local_938.m_backend.data._M_elems[0xe] = 0;
        local_938.m_backend.data._M_elems[0xf] = 0;
        local_938.m_backend.data._M_elems[0x10] = 0;
        local_938.m_backend.data._M_elems[0x11] = 0;
        local_938.m_backend.data._M_elems[0x12] = 0;
        local_938.m_backend.data._M_elems[0x13] = 0;
        local_938.m_backend.data._M_elems[0x14] = 0;
        local_938.m_backend.data._M_elems[0x15] = 0;
        local_938.m_backend.data._M_elems[0x16] = 0;
        local_938.m_backend.data._M_elems[0x17] = 0;
        local_938.m_backend.data._M_elems[0x18] = 0;
        local_938.m_backend.data._M_elems[0x19] = 0;
        local_938.m_backend.data._M_elems._104_5_ = 0;
        local_938.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        local_938.m_backend.exp = 0;
        local_938.m_backend.neg = false;
        pcVar17 = (cpp_dec_float<200u,int,void> *)&local_8b8;
        pnVar11 = &local_238;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pnVar11->m_backend).data._M_elems[0] = *(uint *)pcVar17;
          pcVar17 = pcVar17 + (ulong)bVar21 * -8 + 4;
          pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar11 + ((ulong)bVar21 * -2 + 1) * 4);
        }
        local_238.m_backend.exp = iStack_848;
        local_238.m_backend.neg = (bool)uStack_844;
        local_238.m_backend.fpclass = (fpclass_type)local_840;
        local_238.m_backend.prec_elem = local_840._4_4_;
        minStability((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_7b8,this,&local_238);
        pnVar11 = &local_938;
        pcVar14 = &local_7b8;
        pnVar13 = pnVar11;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pnVar13->m_backend).data._M_elems[0] =
               (((cpp_dec_float<200U,_int,_void> *)&pcVar14->data)->data)._M_elems[0];
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + ((ulong)bVar21 * -2 + 1) * 4)
          ;
          pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar13 + ((ulong)bVar21 * -2 + 1) * 4);
        }
        local_938.m_backend.exp = local_7b8.exp;
        local_938.m_backend.neg = local_7b8.neg;
        local_938.m_backend.fpclass = local_7b8.fpclass;
        local_938.m_backend.prec_elem = local_7b8.prec_elem;
        if (cVar2 == '\0') {
          pnVar13 = &local_338;
          pnVar15 = &local_ac8;
          pnVar18 = pnVar13;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pnVar18->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
            pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar15 + ((ulong)bVar21 * -2 + 1) * 4);
            pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar18 + ((ulong)bVar21 * -2 + 1) * 4);
          }
          local_338.m_backend.exp = local_ac8.m_backend.exp;
          local_338.m_backend.neg = local_ac8.m_backend.neg;
          local_338.m_backend.fpclass = local_ac8.m_backend.fpclass;
          local_338.m_backend.prec_elem = local_ac8.m_backend.prec_elem;
        }
        else {
          pnVar13 = &local_2b8;
          pnVar11 = &local_ac8;
          pnVar15 = pnVar13;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pnVar15->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
            pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar11 + ((ulong)bVar21 * -2 + 1) * 4);
            pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar15 + ((ulong)bVar21 * -2 + 1) * 4);
          }
          local_2b8.m_backend.exp = local_ac8.m_backend.exp;
          local_2b8.m_backend.neg = local_ac8.m_backend.neg;
          local_2b8.m_backend.fpclass = local_ac8.m_backend.fpclass;
          local_2b8.m_backend.prec_elem = local_ac8.m_backend.prec_elem;
          pnVar11 = &local_b8;
        }
        local_ad8 = (DataKey)maxSelect(this,&local_adc,&local_838,pnVar11,
                                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&local_9b8,pnVar13);
        local_a38.fpclass = cpp_dec_float_finite;
        local_a38.prec_elem = 0x1c;
        local_a38.data._M_elems[0] = 0;
        local_a38.data._M_elems[1] = 0;
        local_a38.data._M_elems[2] = 0;
        local_a38.data._M_elems[3] = 0;
        local_a38.data._M_elems[4] = 0;
        local_a38.data._M_elems[5] = 0;
        local_a38.data._M_elems[6] = 0;
        local_a38.data._M_elems[7] = 0;
        local_a38.data._M_elems[8] = 0;
        local_a38.data._M_elems[9] = 0;
        local_a38.data._M_elems[10] = 0;
        local_a38.data._M_elems[0xb] = 0;
        local_a38.data._M_elems[0xc] = 0;
        local_a38.data._M_elems[0xd] = 0;
        local_a38.data._M_elems[0xe] = 0;
        local_a38.data._M_elems[0xf] = 0;
        local_a38.data._M_elems[0x10] = 0;
        local_a38.data._M_elems[0x11] = 0;
        local_a38.data._M_elems[0x12] = 0;
        local_a38.data._M_elems[0x13] = 0;
        local_a38.data._M_elems[0x14] = 0;
        local_a38.data._M_elems[0x15] = 0;
        local_a38.data._M_elems[0x16] = 0;
        local_a38.data._M_elems[0x17] = 0;
        local_a38.data._M_elems[0x18] = 0;
        local_a38.data._M_elems[0x19] = 0;
        local_a38.data._M_elems._104_5_ = 0;
        local_a38.data._M_elems[0x1b]._1_3_ = 0;
        local_a38.exp = 0;
        local_a38.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  (&local_7b8,2,(type *)0x0);
        puVar16 = (uint *)&local_738;
        pcVar14 = &local_a38;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pcVar14->data)._M_elems[0] = *puVar16;
          puVar16 = puVar16 + (ulong)bVar21 * -2 + 1;
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar21 * -8 + 4);
        }
        local_a38.exp = iStack_6c8;
        local_a38.neg = (bool)uStack_6c4;
        local_a38.fpclass = (fpclass_type)local_6c0;
        local_a38.prec_elem = local_6c0._4_4_;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  (&local_a38,&local_7b8);
        if ((local_9b8.fpclass != cpp_dec_float_NaN) && (local_a38.fpclass != cpp_dec_float_NaN)) {
          iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_9b8,&local_a38);
          iVar8 = iVar8 + (iVar9 >> 0x1f);
        }
        iVar8 = iVar8 + 2;
        uVar19 = local_ad0;
      }
      pcVar17 = (cpp_dec_float<200u,int,void> *)&local_8b8;
      pnVar11 = &local_3b8;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pnVar11->m_backend).data._M_elems[0] = *(uint *)pcVar17;
        pcVar17 = pcVar17 + (ulong)bVar21 * -8 + 4;
        pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar11 + ((ulong)bVar21 * -2 + 1) * 4);
      }
      local_3b8.m_backend.exp = iStack_848;
      local_3b8.m_backend.neg = (bool)uStack_844;
      local_3b8.m_backend.fpclass = (fpclass_type)local_840;
      local_3b8.m_backend.prec_elem = local_840._4_4_;
      bVar7 = maxReEnter(this,&local_838,&local_3b8,(SPxId *)&local_ad8,local_adc,SUB41(uVar19,0));
    } while ((bVar7) && (relax(this), iVar8 < 2));
  }
  if ((char)local_acc == '\0') {
LAB_005b96ad:
    if (local_ad8.info == 0) goto LAB_005b96c5;
    bVar7 = false;
LAB_005b9774:
    pnVar11 = &local_838;
    pnVar13 = val;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pnVar13->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar11 + ((ulong)bVar21 * -2 + 1) * 4);
      pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar13 + ((ulong)bVar21 * -2 + 1) * 4);
    }
    (val->m_backend).exp = local_838.m_backend.exp;
    (val->m_backend).neg = local_838.m_backend.neg;
    (val->m_backend).fpclass = local_838.m_backend.fpclass;
    (val->m_backend).prec_elem = local_838.m_backend.prec_elem;
    if (!bVar7) {
      tighten(this);
    }
  }
  else {
    if (local_ad8.info != 0) {
      pSVar5 = (this->
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      if (pSVar5->polishObj == POLISH_FRACTIONALITY) {
        if ((pSVar5->integerVariables).thesize ==
            (pSVar5->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum) {
          if ((0 < local_ad8.info) &&
             (iVar8 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                      ::number(&(pSVar5->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .set,&local_ad8), (pSVar5->integerVariables).data[iVar8] == 1)) {
LAB_005b97de:
            local_ad8.info = 0;
            local_ad8.idx = 0;
            DVar20.info = 0;
            DVar20.idx = -1;
            goto LAB_005b97bf;
          }
        }
        else if (0 < local_ad8.info) goto LAB_005b97de;
      }
      else if ((pSVar5->polishObj == POLISH_INTEGRALITY) &&
              ((local_ad8.info < 0 ||
               (((pSVar5->integerVariables).thesize ==
                 (pSVar5->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum &&
                (iVar8 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                         ::number(&(pSVar5->
                                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).
                                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .
                                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .set,&local_ad8), (pSVar5->integerVariables).data[iVar8] == 0))))
              )) goto LAB_005b97de;
      goto LAB_005b96ad;
    }
LAB_005b96c5:
    pnVar11 = local_a40;
    pnVar13 = &local_938;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pnVar13->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar11 + (ulong)bVar21 * -8 + 4);
      pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar13 + ((ulong)bVar21 * -2 + 1) * 4);
    }
    iVar8 = (this->epsilon).m_backend.exp;
    bVar7 = (this->epsilon).m_backend.neg;
    uVar6._0_4_ = (this->epsilon).m_backend.fpclass;
    uVar6._4_4_ = (this->epsilon).m_backend.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              (&local_7b8,2,(type *)0x0);
    pnVar11 = &local_938;
    pcVar14 = &local_9b8;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pcVar14->data)._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar11 + ((ulong)bVar21 * -2 + 1) * 4);
      pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar21 * -8 + 4);
    }
    local_9b8.exp = iVar8;
    local_9b8.neg = bVar7;
    local_9b8._120_8_ = uVar6;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
              (&local_9b8,&local_7b8);
    if ((((this->minStab).m_backend.fpclass != cpp_dec_float_NaN) &&
        (local_9b8.fpclass != cpp_dec_float_NaN)) &&
       (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&(this->minStab).m_backend,&local_9b8), 0 < iVar8)) {
      bVar7 = local_ad8.info == 0;
      goto LAB_005b9774;
    }
  }
  DVar20 = (DataKey)((ulong)local_ad8 & 0xffffffff00000000);
LAB_005b97bf:
  return (SPxId)((ulong)local_ad8 & 0xffffffff | DVar20);
}

Assistant:

SPxId SPxFastRT<R>::selectEnter(R& val, int, bool polish)
{
   SPxId enterId;
   R max, sel;
   R maxabs = 0.0;
   R delta_shift = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_DELTA_SHIFT);
   int nr;
   int cnt = 0;

   assert(this->m_type == SPxSolverBase<R>::LEAVE);

   resetTols();

   // force instable pivot iff true (see explanation in leave.hpp and spxsolve.hpp)
   bool instable = this->solver()->instableLeave;
   R lowstab = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_LOWSTAB);
   assert(!instable || this->solver()->instableLeaveNum >= 0);

   sel = 0.0;

   if(val > epsilonZero())
   {
      do
      {
         maxabs = 0.0;
         max = val;

         enterId = maxDelta(nr, max, maxabs);

         if(!enterId.isValid())
            return enterId;

         assert(max >= 0.0);
         assert(!enterId.isValid() || !this->solver()->isBasic(enterId));

         if(!shortEnter(enterId, nr, max, maxabs))
         {
            R bestDelta, stab;

            stab = minStability(maxabs);

            // force instable pivot iff instable is true (see explanation in leave.hpp and spxsolve.hpp)
            if(instable)
            {
               enterId = maxSelect(nr, sel, lowstab, bestDelta, max);
            }
            else
            {
               enterId = maxSelect(nr, sel, stab, bestDelta, max);
            }

            if(bestDelta < delta_shift * SOPLEX_TRIES)
               cnt++;
            else
               cnt += SOPLEX_TRIES;
         }

         if(!maxReEnter(sel, maxabs, enterId, nr, polish))
            break;

         relax();
      }
      while(cnt < SOPLEX_TRIES);
   }
   else if(val < -epsilonZero())
   {
      do
      {
         maxabs = 0.0;
         max = val;
         enterId = minDelta(nr, max, maxabs);

         if(!enterId.isValid())
            return enterId;

         assert(max <= 0.0);
         assert(!enterId.isValid() || !this->solver()->isBasic(enterId));

         if(!shortEnter(enterId, nr, max, maxabs))
         {
            R bestDelta, stab;

            stab = minStability(maxabs);

            // force instable pivot iff instable is true (see explanation in leave.hpp and spxsolve.hpp)
            if(instable)
            {
               enterId = minSelect(nr, sel, lowstab, bestDelta, max);
            }
            else
            {
               enterId = minSelect(nr, sel, stab, bestDelta, max);
            }

            if(bestDelta < delta_shift * SOPLEX_TRIES)
               cnt++;
            else
               cnt += SOPLEX_TRIES;
         }

         if(!minReEnter(sel, maxabs, enterId, nr, polish))
            break;

         relax();
      }
      while(cnt < SOPLEX_TRIES);
   }

   SPX_DEBUG(

      if(enterId.isValid())
{
   assert(!enterId.isValid() || !this->solver()->isBasic(enterId));

      R x;

      if(this->thesolver->isCoId(enterId))
         x = this->thesolver->coPvec().delta()[ this->thesolver->number(enterId) ];
      else
         x = this->thesolver->pVec().delta()[ this->thesolver->number(enterId) ];

      std::cout << "DFSTRT03 " << this->thesolver->basis().iteration() << ": "
                << sel << '\t' << x << " (" << maxabs << ")" << std::endl;
   }
   else
      std::cout << "DFSTRT04 " << this->thesolver->basis().iteration()
                << ": skipping instable pivot" << std::endl;
      )

      if(polish && enterId.isValid())
      {
         assert(this->thesolver->rep() == SPxSolverBase<R>::ROW);

         // decide whether the chosen entering index contributes to the polishing objective
         if(this->thesolver->polishObj == SPxSolverBase<R>::POLISH_INTEGRALITY)
         {
            // only allow (integer) variables to enter the basis
            if(enterId.isSPxRowId())
               return SPxId();
            else if(this->thesolver->integerVariables.size() == this->thesolver->nCols()
                    && this->thesolver->integerVariables[this->thesolver->number(enterId)] == 0)
               return SPxId();
         }
         else if(this->thesolver->polishObj == SPxSolverBase<R>::POLISH_FRACTIONALITY)
         {
            // only allow slacks and continuous variables to enter the basis
            if(this->thesolver->integerVariables.size() == this->thesolver->nCols())
            {
               if(enterId.isSPxColId() && this->thesolver->integerVariables[this->thesolver->number(enterId)] == 1)
                  return SPxId();
            }
            else if(enterId.isSPxColId())
               return SPxId();
         }
      }


   if(enterId.isValid() || minStab > 2 * epsilonZero())
   {
      val = sel;

      if(enterId.isValid())
         tighten();
   }

   assert(!enterId.isValid() || !this->solver()->isBasic(enterId));

   return enterId;
}